

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O2

bool __thiscall
ServerService::sendSegments
          (ServerService *this,byte *data,int socketFD,sockaddr_storage clientDetails,
          int recvWindowSize)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  uint __i;
  int iVar10;
  byte4 seqNo;
  byte *__s;
  SendUnit *this_00;
  Congestion *this_01;
  long lVar11;
  ostream *poVar12;
  Sliding *pSVar13;
  ServerSegment *rudp;
  size_type sVar14;
  size_type sVar15;
  reference ppSVar16;
  size_type sVar17;
  int *piVar18;
  byte4 bVar19;
  char *pcVar20;
  sockaddr_storage *psVar21;
  sockaddr *psVar22;
  SendUnit *this_02;
  ServerService *pSVar23;
  byte4 seqNo_00;
  byte4 seqNo_01;
  ulong uVar24;
  int i;
  int iVar25;
  ulong __n;
  bool bVar26;
  byte bVar27;
  double dVar28;
  double end;
  sockaddr_storage in_stack_fffffffffffffd98;
  byte4 local_1d4;
  timeval timeValue;
  deque<Sliding_*,_std::allocator<Sliding_*>_> window;
  fd_set readFDs;
  Sliding *local_b0 [16];
  
  bVar27 = 0;
  iVar10 = rand();
  seqNo_00 = iVar10 % 100;
  __s = (byte *)calloc(0x5c0,1);
  this_00 = (SendUnit *)operator_new(0x20);
  SendUnit::SendUnit(this_00,seqNo_00,data);
  this_01 = (Congestion *)operator_new(0x38);
  Congestion::Congestion(this_01,recvWindowSize);
  for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
    readFDs.fds_bits[lVar11] = 0;
  }
  uVar24 = 1L << ((byte)socketFD & 0x3f);
  readFDs.fds_bits[socketFD / 0x40] = readFDs.fds_bits[socketFD / 0x40] | uVar24;
  timeValue.tv_sec = 0;
  timeValue.tv_usec = 50000;
  std::_Deque_base<Sliding_*,_std::allocator<Sliding_*>_>::_Deque_base
            (&window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>);
  std::deque<Sliding_*,_std::allocator<Sliding_*>_>::clear
            ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)
             &window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>);
  bVar19 = -seqNo_00;
  seqNo_01 = seqNo_00;
  local_1d4 = seqNo_00;
  seqNo = bVar19;
  do {
    dVar28 = (double)recvWindowSize;
    if (this_01->cwnd <= (double)recvWindowSize) {
      dVar28 = this_01->cwnd;
    }
    pcVar20 = "Sending Packets in mode: Congestion Avoidance";
    if (this_01->isSlowStart != false) {
      pcVar20 = "Sending Packets in mode: Slow Start";
    }
    poVar12 = std::operator<<((ostream *)&std::cout,pcVar20);
    std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<((ostream *)&std::cout,"Maximum Packets that will be sent:");
    iVar10 = (int)dVar28;
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar10);
    std::endl<char,std::char_traits<char>>(poVar12);
    std::operator<<((ostream *)&std::cout,"RetransmissionTime-Out: ");
    poVar12 = std::ostream::_M_insert<double>(this_01->RTO);
    std::endl<char,std::char_traits<char>>(poVar12);
    std::deque<Sliding_*,_std::allocator<Sliding_*>_>::clear(&window);
    for (; (bVar26 = iVar10 != 0, iVar10 = iVar10 + -1, bVar26 &&
           ((ulong)(bVar19 + seqNo_01) < this_00->dataSize)); seqNo_01 = seqNo_01 + 0x5b0) {
      __s = SendUnit::getSendUnit(this_00,seqNo_01);
      psVar21 = &clientDetails;
      psVar22 = (sockaddr *)local_b0;
      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
        cVar4 = psVar21->__ss_padding[0];
        cVar5 = psVar21->__ss_padding[1];
        cVar6 = psVar21->__ss_padding[2];
        cVar7 = psVar21->__ss_padding[3];
        cVar8 = psVar21->__ss_padding[4];
        cVar9 = psVar21->__ss_padding[5];
        psVar22->sa_family = psVar21->ss_family;
        psVar22->sa_data[0] = cVar4;
        psVar22->sa_data[1] = cVar5;
        psVar22->sa_data[2] = cVar6;
        psVar22->sa_data[3] = cVar7;
        psVar22->sa_data[4] = cVar8;
        psVar22->sa_data[5] = cVar9;
        psVar21 = (sockaddr_storage *)((long)psVar21 + (ulong)bVar27 * -0x10 + 8);
        psVar22 = (sockaddr *)(psVar22[-(ulong)bVar27].sa_data + 6);
      }
      sendto(socketFD,__s,0x5c0,0,(sockaddr *)local_b0,0x80);
      pSVar13 = (Sliding *)operator_new(0x18);
      this_02 = this_00;
      rudp = SendUnit::getRUDP(this_00,seqNo_01);
      dVar28 = getTime((ServerService *)this_02);
      Sliding::Sliding(pSVar13,rudp,dVar28);
      local_b0[0] = pSVar13;
      std::deque<Sliding*,std::allocator<Sliding*>>::emplace_back<Sliding*>
                ((deque<Sliding*,std::allocator<Sliding*>> *)&window,local_b0);
    }
    sVar14 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size(&window);
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      readFDs.fds_bits[lVar11] = 0;
    }
    readFDs.fds_bits[socketFD / 0x40] = readFDs.fds_bits[socketFD / 0x40] | uVar24;
    if ((timeValue.tv_usec != 0) && (timeValue.tv_sec != 0)) {
      timeValue.tv_sec = (long)this_01->RTO / 1000000000;
      timeValue.tv_usec = (__suseconds_t)(this_01->RTO * 1000.0 - (double)timeValue.tv_sec);
    }
    sVar17 = 0;
    do {
      while( true ) {
        while( true ) {
          iVar25 = (int)sVar17;
          iVar10 = select(socketFD + 1,(fd_set *)&readFDs,(fd_set *)0x0,(fd_set *)0x0,
                          (timeval *)&timeValue);
          if (iVar10 == -1) {
            poVar12 = std::operator<<((ostream *)&std::cout,"Error in Select");
            std::endl<char,std::char_traits<char>>(poVar12);
            piVar18 = __errno_location();
            pcVar20 = strerror(*piVar18);
            poVar12 = std::operator<<((ostream *)&std::cerr,pcVar20);
            std::endl<char,std::char_traits<char>>(poVar12);
            exit(5);
          }
          if (0 < iVar10) break;
          if (iVar10 == 0) {
            poVar12 = std::operator<<((ostream *)&std::cout,"Timeout Event ");
            std::endl<char,std::char_traits<char>>(poVar12);
            if (timeValue.tv_usec == 0 && timeValue.tv_sec == 0) {
              std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size(&window);
              sVar17 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size(&window);
              if (sVar17 != 0) {
                sVar17 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size(&window);
                iVar25 = (int)sVar17;
                psVar21 = &clientDetails;
                pSVar23 = (ServerService *)&stack0xfffffffffffffd98;
                for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
                  uVar3._0_2_ = psVar21->ss_family;
                  uVar3._2_1_ = psVar21->__ss_padding[0];
                  uVar3._3_1_ = psVar21->__ss_padding[1];
                  uVar3._4_1_ = psVar21->__ss_padding[2];
                  uVar3._5_1_ = psVar21->__ss_padding[3];
                  uVar3._6_1_ = psVar21->__ss_padding[4];
                  uVar3._7_1_ = psVar21->__ss_padding[5];
                  pSVar23->broadcastFD = (int)uVar3;
                  pSVar23->serverPort = (int)((ulong)uVar3 >> 0x20);
                  psVar21 = (sockaddr_storage *)((long)psVar21 + (ulong)bVar27 * -0x10 + 8);
                  pSVar23 = (ServerService *)((long)pSVar23 + (ulong)bVar27 * -0x10 + 8);
                }
                retransmit(pSVar23,seqNo,socketFD,in_stack_fffffffffffffd98,this_00);
                poVar12 = std::operator<<((ostream *)&std::cout,"Retransmitting : ");
                poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                std::endl<char,std::char_traits<char>>(poVar12);
                std::deque<Sliding_*,_std::allocator<Sliding_*>_>::clear(&window);
              }
              Congestion::slowStart(this_01);
            }
            goto LAB_00103512;
          }
        }
        psVar21 = &clientDetails;
        pSVar23 = (ServerService *)&stack0xfffffffffffffd98;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          uVar1._0_2_ = psVar21->ss_family;
          uVar1._2_1_ = psVar21->__ss_padding[0];
          uVar1._3_1_ = psVar21->__ss_padding[1];
          uVar1._4_1_ = psVar21->__ss_padding[2];
          uVar1._5_1_ = psVar21->__ss_padding[3];
          uVar1._6_1_ = psVar21->__ss_padding[4];
          uVar1._7_1_ = psVar21->__ss_padding[5];
          pSVar23->broadcastFD = (int)uVar1;
          pSVar23->serverPort = (int)((ulong)uVar1 >> 0x20);
          psVar21 = (sockaddr_storage *)((long)psVar21 + (ulong)bVar27 * -0x10 + 8);
          pSVar23 = (ServerService *)((long)pSVar23 + (ulong)bVar27 * -0x10 + 8);
        }
        seqNo = readAck(pSVar23,socketFD,in_stack_fffffffffffffd98);
        poVar12 = std::operator<<((ostream *)&std::cout,"Ack Event ");
        std::endl<char,std::char_traits<char>>(poVar12);
        if (local_1d4 < seqNo) break;
        this_01->dupAck = this_01->dupAck + 1;
        poVar12 = std::operator<<((ostream *)&std::cout,"Dup ACK: ");
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        poVar12 = std::operator<<(poVar12," ACK Count:");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,this_01->dupAck);
        std::endl<char,std::char_traits<char>>(poVar12);
        if (2 < this_01->dupAck) {
          psVar21 = &clientDetails;
          pSVar23 = (ServerService *)&stack0xfffffffffffffd98;
          for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
            uVar2._0_2_ = psVar21->ss_family;
            uVar2._2_1_ = psVar21->__ss_padding[0];
            uVar2._3_1_ = psVar21->__ss_padding[1];
            uVar2._4_1_ = psVar21->__ss_padding[2];
            uVar2._5_1_ = psVar21->__ss_padding[3];
            uVar2._6_1_ = psVar21->__ss_padding[4];
            uVar2._7_1_ = psVar21->__ss_padding[5];
            pSVar23->broadcastFD = (int)uVar2;
            pSVar23->serverPort = (int)((ulong)uVar2 >> 0x20);
            psVar21 = (sockaddr_storage *)((long)psVar21 + (ulong)bVar27 * -0x10 + 8);
            pSVar23 = (ServerService *)((long)pSVar23 + (ulong)bVar27 * -0x10 + 8);
          }
          retransmit(pSVar23,seqNo,socketFD,in_stack_fffffffffffffd98,this_00);
          Congestion::updateRTO(this_01);
          poVar12 = std::operator<<((ostream *)&std::cout,"Retransmitting : ");
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::endl<char,std::char_traits<char>>(poVar12);
          sVar17 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size(&window);
          if ((sVar17 != 0) &&
             ((*window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur)->mark == false)) {
            for (__n = 0; sVar17 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size(&window),
                __n < sVar17 - 1; __n = __n + 1) {
              ppSVar16 = std::_Deque_iterator<Sliding_*,_Sliding_*&,_Sliding_**>::operator[]
                                   (&window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>
                                     ._M_impl.super__Deque_impl_data._M_start,__n);
              (*ppSVar16)->mark = true;
            }
          }
          Congestion::slowStart(this_01);
          this_01->dupAck = 0;
          sVar17 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size(&window);
        }
      }
      poVar12 = std::operator<<((ostream *)&std::cout,"New ACK: ");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::endl<char,std::char_traits<char>>(poVar12);
      pSVar23 = (ServerService *)&window;
      sVar15 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size
                         ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)pSVar23);
      if ((sVar15 != 0) &&
         ((*window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur)->seqNo <= seqNo - 0x5b0)) {
        while ((window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur !=
                window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur &&
               ((pSVar13 = *window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>._M_impl.
                            super__Deque_impl_data._M_start._M_cur, pSVar13->seqNo < seqNo &&
                (pSVar13->mark == false))))) {
          dVar28 = pSVar13->sentTime;
          end = getTime(pSVar23);
          Congestion::updateRTT(this_01,dVar28,end);
          pSVar23 = (ServerService *)&window;
          std::deque<Sliding_*,_std::allocator<Sliding_*>_>::pop_front
                    ((deque<Sliding_*,_std::allocator<Sliding_*>_> *)pSVar23);
        }
      }
      sVar15 = std::deque<Sliding_*,_std::allocator<Sliding_*>_>::size(&window);
      local_1d4 = seqNo;
    } while (sVar15 != 0);
    dVar28 = this_01->ssthresh;
    if ((dVar28 <= this_01->cwnd) && ((dVar28 != -1.0 || (NAN(dVar28))))) {
      this_01->isSlowStart = false;
      poVar12 = std::operator<<((ostream *)&std::cout,"Entering Congestion Avoidance mode");
      std::endl<char,std::char_traits<char>>(poVar12);
    }
    if (this_01->isSlowStart == true) {
      Congestion::updateSlowStart(this_01);
    }
    else {
      Congestion::updateCongestionAvoidance(this_01);
    }
    iVar25 = 0;
LAB_00103512:
    poVar12 = std::operator<<((ostream *)&std::cout,"Percentage of Packets Sent: ");
    iVar10 = (int)sVar14;
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar10 - iVar25);
    poVar12 = std::operator<<(poVar12,"/");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar10);
    poVar12 = std::operator<<(poVar12," = ");
    poVar12 = (ostream *)
              std::ostream::operator<<(poVar12,((float)(iVar10 - iVar25) / (float)iVar10) * 100.0);
    std::endl<char,std::char_traits<char>>(poVar12);
    if ((this_00->dataSize < (ulong)(bVar19 + seqNo_01)) ||
       (this_00->dataSize < (ulong)(seqNo - seqNo_00))) {
      poVar12 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar12 = std::operator<<(poVar12,
                                "Last Packet has been delivered & All ACKs have been received");
      std::endl<char,std::char_traits<char>>(poVar12);
      memset(__s,0,0x5c0);
      operator_delete(this_00,0x20);
      std::_Deque_base<Sliding_*,_std::allocator<Sliding_*>_>::~_Deque_base
                (&window.super__Deque_base<Sliding_*,_std::allocator<Sliding_*>_>);
      return true;
    }
  } while( true );
}

Assistant:

bool
ServerService::sendSegments(byte *data, int socketFD, struct sockaddr_storage clientDetails, int recvWindowSize) {

    byte4 initSeqNo = rand() % 100;
    byte4 seqNo = initSeqNo;
    byte4 sendBase = initSeqNo;

    byte *buffer = (byte *) calloc(MTU, sizeof(byte));
    memset(buffer, 0, MTU);

    //使用序号获取 udp
    auto *sendUnit = new SendUnit(initSeqNo, data);

    auto *congestion = new Congestion(recvWindowSize);

    // 丢包数
    int packetDropped = 0;
    //数据分段数量
    int packetNumber = (int) (sendUnit->dataSize / (MTU - HEADER_LEN)) + 1;

    fd_set readFDs; // fd_set 来存储文件描述符, 用于使用多个套接字时不阻塞线程
    FD_ZERO(&readFDs); //FD_ZERO宏将一个 fd_set 类型变量的所有位都设为 0
    FD_SET(socketFD, &readFDs);
    int nextFD = socketFD + 1;

    byte4 ackNo;

    struct timeval timeValue;
    timeValue.tv_sec = 0; //秒
    timeValue.tv_usec = INIT_SEC; //微秒

    //双端队列实现滑动窗口
    deque<Sliding *> window;
    window.clear();
    int readyDescriptors; // -1 -> Error
    int sendDataNum; // 单次需要发送数据段数量
    int SlideWindowDataNum = 0;
    int left = 0;

    while (true) {
        sendDataNum = (int) min(congestion->cwnd, (double) recvWindowSize);
        if (congestion->isSlowStart) {
            cout << "Sending Packets in mode: Slow Start" << endl;
            cout << "Maximum Packets that will be sent:" << sendDataNum << endl;
        } else {
            cout << "Sending Packets in mode: Congestion Avoidance" << endl;
            cout << "Maximum Packets that will be sent:" << sendDataNum << endl;
        }

        cout << "RetransmissionTime-Out: " << congestion->RTO << endl;
        window.clear();

        //向滑动窗格填充数据
        while (sendDataNum != 0 && (seqNo - initSeqNo) < sendUnit->dataSize) {
            buffer = sendUnit->getSendUnit(seqNo);
            sendResponse(socketFD, buffer, clientDetails);
            window.push_back(new Sliding(sendUnit->getRUDP(seqNo), getTime()));
            seqNo += (MTU - HEADER_LEN);
            sendDataNum--;
        }
        //获取滑动窗格分组数
        SlideWindowDataNum = (int) window.size();

        FD_ZERO(&readFDs);
        FD_SET(socketFD, &readFDs);
        if (timeValue.tv_usec != 0 && timeValue.tv_sec != 0) {
            timeValue.tv_sec = (long) congestion->RTO / NANO_SEC;
            timeValue.tv_usec = (congestion->RTO) * 1000 - timeValue.tv_sec;
        }

        while (true) {
            readyDescriptors = select(nextFD, &readFDs, NULL, NULL, &timeValue);
            if (readyDescriptors == -1) {
                cout << "Error in Select" << endl;
                cerr << strerror(errno) << endl;
                exit(5);
            } else if (readyDescriptors > 0) {
                // ACK 判断
                ackNo = readAck(socketFD, clientDetails);
                cout << "Ack Event " << endl;
                if (sendBase < ackNo) {
                    // 创建新 ACK
                    cout << "New ACK: " << ackNo << endl;
                    sendBase = ackNo;
                    if (window.size() > 0 && sendBase - (MTU - HEADER_LEN) >= window.front()->seqNo) {
                        while (!window.empty()) {
                            if (window.front()->seqNo < sendBase && window.front()->mark == false) {
                                congestion->updateRTT(window.front()->sentTime, getTime());
                                window.pop_front();
                            } else {
                                break;
                            }
                        }
                    }
                    if (window.size() == 0) {
                        left = 0;
                        if (congestion->cwnd >= congestion->ssthresh && congestion->ssthresh != -1) {
                            congestion->isSlowStart = false; // congestion avoidance
                            cout << "Entering Congestion Avoidance mode" << endl;
                        }
                        if (congestion->isSlowStart) {
                            congestion->updateSlowStart();
                        } else {
                            congestion->updateCongestionAvoidance();
                        }
                        break;
                    }
                } else {
                    // 重复的 ACK 确认
                    congestion->dupAck++;
                    cout << "Dup ACK: " << ackNo << " ACK Count:" << congestion->dupAck << endl;
                    if (congestion->dupAck >= 3) {
                        // 三次收到重复 ACK 后立即重传
                        retransmit(ackNo, socketFD, clientDetails, sendUnit);
                        congestion->updateRTO();
                        packetDropped++;
                        cout << "Retransmitting : " << ackNo << endl;
                        if (window.size() != 0) {
                            if (!window.front()->mark) {
                                for (int i = 0; i < window.size() - 1; i++) {
                                    window[i]->mark = true;
                                }
                            }
                        }
                        congestion->slowStart();
                        congestion->dupAck = 0;
                        left = window.size();
                    }
                }
            } else if (readyDescriptors == 0) {
                // 超时
                cout << "Timeout Event " << endl;
                if (timeValue.tv_sec == 0 && timeValue.tv_usec == 0) {
                    // Loss occurred go back to slow start
                    packetDropped += window.size();
                    if (window.size() != 0) {
                        left = window.size();
                        retransmit(ackNo, socketFD, clientDetails, sendUnit);
                        cout << "Retransmitting : " << window.front()->seqNo << endl;
                        window.clear();
                    }
                    congestion->slowStart();
                }
                break;
            }
        }

        cout << "Percentage of Packets Sent: " << SlideWindowDataNum - left << "/" << SlideWindowDataNum << " = "
             << ((float) (SlideWindowDataNum - left) / SlideWindowDataNum) * 100 << endl;
        SlideWindowDataNum = 0, left = 0;
        if ((seqNo - initSeqNo) > sendUnit->dataSize || (ackNo - initSeqNo) > sendUnit->dataSize) {
            cout << endl << "Last Packet has been delivered & All ACKs have been received" << endl;
            break;
        }
    }

    memset(buffer, 0, MTU);
    delete sendUnit;
    return true;
}